

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_addcaption_scc(flvtag_t *tag,scc_t *scc)

{
  uint32_t uVar1;
  int iVar2;
  sei_t sei;
  sei_t local_30;
  
  uVar1 = flvtag_pts(tag);
  sei_init(&local_30,(double)uVar1);
  sei_from_scc(&local_30,scc);
  iVar2 = flvtag_addsei(tag,&local_30);
  sei_free(&local_30);
  return iVar2;
}

Assistant:

int flvtag_addcaption_scc(flvtag_t* tag, const scc_t* scc)
{
    sei_t sei;
    sei_init(&sei, flvtag_pts(tag));
    sei_from_scc(&sei, scc);
    int ret = flvtag_addsei(tag, &sei);
    sei_free(&sei);
    return ret;
}